

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests_tryPullOutCardFromFoundationPileOnLeftButtonDownEvent_Test::
~EventsProcessorTests_tryPullOutCardFromFoundationPileOnLeftButtonDownEvent_Test
          (EventsProcessorTests_tryPullOutCardFromFoundationPileOnLeftButtonDownEvent_Test *this)

{
  EventsProcessorTests_tryPullOutCardFromFoundationPileOnLeftButtonDownEvent_Test *this_local;
  
  ~EventsProcessorTests_tryPullOutCardFromFoundationPileOnLeftButtonDownEvent_Test(this);
  operator_delete(this,0xf20);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       tryPullOutCardFromFoundationPileOnLeftButtonDownEvent)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount - 1);
    acceptLeftButtonDownOnFoundationPile(lastFoundationPileId, mouseLeftButtonDownEvent);
    EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
    EXPECT_CALL(solitaireMock, tryPullOutCardFromFoundationPile(lastFoundationPileId));
    EXPECT_CALL(contextMock, setMousePosition(mouseLeftButtonDownEvent.position));
    EXPECT_CALL(foundationPileColliderMock, getPosition()).WillOnce(Return(pilePosition));
    EXPECT_CALL(contextMock, setCardsInHandPosition(pilePosition));
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}